

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void forget_levels(int percent)

{
  xchar xVar1;
  xchar xVar2;
  long lVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  int iVar7;
  undefined1 *puVar8;
  level *plVar9;
  trap *ptVar10;
  long lVar11;
  ulong uVar12;
  int indices [512];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_levels: bad percent %d",(ulong)(uint)percent);
      return;
    }
    xVar1 = ledger_no(&u.uz);
    xVar2 = maxledgerno();
    cVar5 = -1;
    if (-1 < xVar2) {
      cVar5 = xVar2;
    }
    iVar7 = 0;
    for (uVar12 = 0; (long)cVar5 + 1U != uVar12; uVar12 = uVar12 + 1) {
      if (((levels[uVar12] != (level *)0x0) && (((levels[uVar12]->flags).field_0xa & 0x40) == 0)) &&
         ((uint)(int)xVar1 != uVar12)) {
        xVar2 = ledger_to_dnum((xchar)uVar12);
        if (xVar2 == dungeon_topology.d_sokoban_dnum) {
          percent = percent + 2;
        }
        else {
          lVar3 = (long)iVar7;
          iVar7 = iVar7 + 1;
          indices[lVar3] = (int)uVar12;
        }
      }
    }
    if (99 < percent) {
      percent = 100;
    }
    randomize(indices,iVar7);
    uVar12 = (long)(percent * iVar7 + 0x32) / 100;
    uVar6 = 0;
    uVar4 = uVar12 & 0xffffffff;
    if ((int)uVar12 < 1) {
      uVar4 = uVar6;
    }
    for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
      iVar7 = indices[uVar6];
      puVar8 = &(levels[iVar7]->flags).field_0x8;
      *(uint *)puVar8 = *(uint *)puVar8 | 0x400000;
      plVar9 = levels[iVar7];
      if ((plVar9->z).dnum != dungeon_topology.d_sokoban_dnum) {
        puVar8 = &plVar9->locations[0][0].field_0x6;
        for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 1) {
          for (lVar11 = 0; lVar11 != 0xfc; lVar11 = lVar11 + 0xc) {
            puVar8[lVar11 + -1] = 0;
            *(undefined4 *)(puVar8 + lVar11 + -6) = 0;
            *(uint *)(puVar8 + lVar11) = *(uint *)(puVar8 + lVar11) & 0xfffff7f3;
          }
          puVar8 = puVar8 + 0xfc;
        }
        plVar9 = levels[iVar7];
      }
      xVar2 = u.uy;
      xVar1 = u.ux;
      ptVar10 = (trap *)&plVar9->lev_traps;
      while (ptVar10 = ptVar10->ntrap, ptVar10 != (trap *)0x0) {
        if (((ptVar10->tx != xVar1) || (ptVar10->ty != xVar2)) &&
           ((ptVar10->field_0x8 & 0x1f) != 0xd)) {
          ptVar10->field_0x8 = ptVar10->field_0x8 & 0xdf;
        }
      }
      levels[iVar7]->levname[0] = '\0';
    }
  }
  return;
}

Assistant:

void forget_levels(int percent)
{
	int i, count;
	xchar  maxl, this_lev;
	int indices[MAXLINFO];

	if (percent == 0) return;

	if (percent <= 0 || percent > 100) {
	    impossible("forget_levels: bad percent %d", percent);
	    return;
	}

	this_lev = ledger_no(&u.uz);
	maxl = maxledgerno();

	/* count & save indices of non-forgotten visited levels */
	/* Sokoban levels are pre-mapped for the player, and should stay
	 * so, or they become nearly impossible to solve.  But try to
	 * shift the forgetting elsewhere by fiddling with percent
	 * instead of forgetting fewer levels.
	 */
	for (count = 0, i = 0; i <= maxl; i++)
	    if ((levels[i] && !levels[i]->flags.forgotten) && i != this_lev) {
		if (ledger_to_dnum(i) == sokoban_dnum)
		    percent += 2;
		else
		    indices[count++] = i;
	    }
	
	if (percent > 100) percent = 100;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++) {
	    levels[indices[i]]->flags.forgotten = TRUE;
	    forget_map(levels[indices[i]], TRUE);
	    forget_traps(levels[indices[i]]);
	    levels[indices[i]]->levname[0] = '\0';
	}
}